

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

char hunyise_main_huase(void)

{
  _Hash_node_base *p_Var1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char cVar6;
  int iVar7;
  __node_base _Var8;
  
  iVar5 = 0;
  iVar4 = 0;
  iVar7 = 0;
  if (my_active_card_abi_cxx11_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    iVar7 = 0;
    iVar4 = 0;
    iVar5 = 0;
    _Var8._M_nxt = my_active_card_abi_cxx11_._M_h._M_before_begin._M_nxt;
    do {
      p_Var1 = _Var8._M_nxt + 1;
      _Var8._M_nxt = (_Var8._M_nxt)->_M_nxt;
      cVar2 = *(char *)&p_Var1->_M_nxt->_M_nxt;
      iVar4 = iVar4 + (uint)(cVar2 == 'W');
      iVar5 = iVar5 + (uint)(cVar2 == 'B');
      iVar7 = iVar7 + (uint)(cVar2 == 'T');
    } while (_Var8._M_nxt != (_Hash_node_base *)0x0);
  }
  cVar2 = 'n';
  if (-1 < iVar7) {
    cVar2 = 'T';
  }
  iVar3 = 0;
  if (-1 < iVar7) {
    iVar3 = iVar7;
  }
  cVar6 = 'B';
  if (iVar5 < iVar3) {
    cVar6 = cVar2;
  }
  if (iVar3 < iVar5) {
    iVar3 = iVar5;
  }
  cVar2 = 'W';
  if (iVar4 < iVar3) {
    cVar2 = cVar6;
  }
  return cVar2;
}

Assistant:

char hunyise_main_huase() {
	int tiao = 0, bin = 0, wan = 0;
	for (auto it = my_active_card.begin(); it != my_active_card.end(); it++) {
		if (it->first[0] == 'W') wan++;
		if (it->first[0] == 'B') bin++;
		if (it->first[0] == 'T') tiao++;
	}
	char max = 'n';
	int maxnum = 0;
	if (tiao >= maxnum) {
		max = 'T';
		maxnum = tiao;
	}
	if (bin >= maxnum) {
		max = 'B';
		maxnum = bin;
	}
	if (wan >= maxnum) {
		max = 'W';
		maxnum = wan;
	}
	return max;
}